

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * stbi_psd_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  FILE *f;
  stbi_uc *data;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  char *filename_local;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)stbi_psd_load_from_file((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return (stbi_uc *)filename_local;
}

Assistant:

stbi_uc *stbi_psd_load(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   stbi_uc *data;
   FILE *f = fopen(filename, "rb");
   if (!f) return NULL;
   data = stbi_psd_load_from_file(f, x,y,comp,req_comp);
   fclose(f);
   return data;
}